

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_read_radix(mp_int *a,char *str,int radix)

{
  int in_EDX;
  mp_int *in_RSI;
  mp_int *in_RDI;
  bool bVar1;
  mp_int *in_stack_00000008;
  char ch;
  int neg;
  int res;
  int y;
  char local_30;
  uint local_28;
  int local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  mp_zero(in_RDI);
  if ((in_EDX < 2) || (0x40 < in_EDX)) {
    iVar2 = -3;
  }
  else {
    bVar1 = (char)in_RSI->used == '-';
    if (bVar1) {
      in_RSI = (mp_int *)((long)&in_RSI->used + 1);
    }
    local_28 = (uint)bVar1;
    mp_zero(in_RDI);
    for (; (char)in_RSI->used != '\0'; in_RSI = (mp_int *)((long)&in_RSI->used + 1)) {
      if (in_EDX < 0x24) {
        iVar2 = toupper((int)(char)in_RSI->used);
        local_30 = (char)iVar2;
      }
      else {
        local_30 = (char)in_RSI->used;
      }
      for (local_20 = 0; (local_20 < 0x40 && (local_30 != mp_s_rmap[local_20]));
          local_20 = local_20 + 1) {
      }
      if (in_EDX <= local_20) break;
      iVar2 = mp_mul_d((mp_int *)CONCAT44(radix,y),_neg,in_stack_00000008);
      if (iVar2 != 0) {
        return iVar2;
      }
      iVar2 = mp_add_d((mp_int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (mp_digit)in_RDI,in_RSI);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    if (in_RDI->used != 0) {
      in_RDI->sign = local_28;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mp_read_radix (mp_int * a, const char *str, int radix)
{
  int     y, res, neg;
  char    ch;

  /* zero the digit bignum */
  mp_zero(a);

  /* make sure the radix is ok */
  if (radix < 2 || radix > 64) {
    return MP_VAL;
  }

  /* if the leading digit is a 
   * minus set the sign to negative. 
   */
  if (*str == '-') {
    ++str;
    neg = MP_NEG;
  } else {
    neg = MP_ZPOS;
  }

  /* set the integer to the default of zero */
  mp_zero (a);
  
  /* process each digit of the string */
  while (*str) {
    /* if the radix < 36 the conversion is case insensitive
     * this allows numbers like 1AB and 1ab to represent the same  value
     * [e.g. in hex]
     */
    ch = (char) ((radix < 36) ? toupper (*str) : *str);
    for (y = 0; y < 64; y++) {
      if (ch == mp_s_rmap[y]) {
         break;
      }
    }

    /* if the char was found in the map 
     * and is less than the given radix add it
     * to the number, otherwise exit the loop. 
     */
    if (y < radix) {
      if ((res = mp_mul_d (a, (mp_digit) radix, a)) != MP_OKAY) {
         return res;
      }
      if ((res = mp_add_d (a, (mp_digit) y, a)) != MP_OKAY) {
         return res;
      }
    } else {
      break;
    }
    ++str;
  }
  
  /* set the sign only if a != 0 */
  if (mp_iszero(a) != 1) {
     a->sign = neg;
  }
  return MP_OKAY;
}